

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_7bytes.cpp
# Opt level: O3

Sketch * ConstructClMul7Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul7Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_49
    case 49: return new SketchImpl<Field49>(implementation, 49);
#endif
#ifdef ENABLE_FIELD_INT_50
    case 50: return new SketchImpl<Field50>(implementation, 50);
#endif
#ifdef ENABLE_FIELD_INT_51
    case 51: return new SketchImpl<Field51>(implementation, 51);
#endif
#ifdef ENABLE_FIELD_INT_52
    case 52: return new SketchImpl<Field52>(implementation, 52);
#endif
#ifdef ENABLE_FIELD_INT_53
    case 53: return new SketchImpl<Field53>(implementation, 53);
#endif
#ifdef ENABLE_FIELD_INT_54
    case 54: return new SketchImpl<Field54>(implementation, 54);
#endif
#ifdef ENABLE_FIELD_INT_55
    case 55: return new SketchImpl<Field55>(implementation, 55);
#endif
#ifdef ENABLE_FIELD_INT_56
    case 56: return new SketchImpl<Field56>(implementation, 56);
#endif
    }
    return nullptr;
}